

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDrawPixel(Image *dst,int x,int y,Color color)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector4 coln_7;
  Vector3 coln_6;
  Vector3 coln_5;
  uchar a_1;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  Vector4 coln_4;
  uchar a;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  Vector4 coln_3;
  uchar b;
  uchar g;
  uchar r;
  Vector3 coln_2;
  uchar gray_1;
  Vector3 coln_1;
  uchar gray;
  Vector3 coln;
  int y_local;
  int x_local;
  Image *dst_local;
  Color color_local;
  
  if ((((dst->data != (void *)0x0) && (-1 < x)) && (x < dst->width)) &&
     ((-1 < y && (y < dst->height)))) {
    dst_local._4_1_ = color.r;
    dst_local._5_1_ = color.g;
    dst_local._6_1_ = color.b;
    dst_local._7_1_ = color.a;
    switch(dst->format) {
    case 1:
      *(char *)((long)dst->data + (long)(y * dst->width + x)) =
           (char)(int)((((float)dst_local._6_1_ / 255.0) * 0.114 +
                       ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                       ((float)dst_local._5_1_ / 255.0) * 0.587) * 255.0);
      break;
    case 2:
      *(char *)((long)dst->data + (long)((y * dst->width + x) * 2)) =
           (char)(int)((((float)dst_local._6_1_ / 255.0) * 0.114 +
                       ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                       ((float)dst_local._5_1_ / 255.0) * 0.587) * 255.0);
      *(byte *)((long)dst->data + (long)((y * dst->width + x) * 2 + 1)) = dst_local._7_1_;
      break;
    case 3:
      dVar1 = round((double)(((float)((uint)color & 0xff) / 255.0) * 31.0));
      dVar2 = round((double)(((float)dst_local._5_1_ / 255.0) * 63.0));
      dVar3 = round((double)(((float)dst_local._6_1_ / 255.0) * 31.0));
      *(ushort *)((long)dst->data + (long)(y * dst->width + x) * 2) =
           (ushort)(byte)(int)dVar1 << 0xb | (ushort)(byte)(int)dVar2 << 5 |
           (ushort)(byte)(int)dVar3;
      break;
    case 4:
      *(uchar *)((long)dst->data + (long)((y * dst->width + x) * 3)) = dst_local._4_1_;
      *(byte *)((long)dst->data + (long)((y * dst->width + x) * 3 + 1)) = dst_local._5_1_;
      *(byte *)((long)dst->data + (long)((y * dst->width + x) * 3 + 2)) = dst_local._6_1_;
      break;
    case 5:
      dVar1 = round((double)(((float)((uint)color & 0xff) / 255.0) * 31.0));
      dVar2 = round((double)(((float)dst_local._5_1_ / 255.0) * 31.0));
      dVar3 = round((double)(((float)dst_local._6_1_ / 255.0) * 31.0));
      *(ushort *)((long)dst->data + (long)(y * dst->width + x) * 2) =
           (ushort)(byte)(int)dVar1 << 0xb | (ushort)(byte)(int)dVar2 << 6 |
           (ushort)(byte)(int)dVar3 << 1 | (ushort)(0.19607843 < (float)dst_local._7_1_ / 255.0);
      break;
    case 6:
      dVar1 = round((double)(((float)((uint)color & 0xff) / 255.0) * 15.0));
      dVar2 = round((double)(((float)dst_local._5_1_ / 255.0) * 15.0));
      dVar3 = round((double)(((float)dst_local._6_1_ / 255.0) * 15.0));
      dVar4 = round((double)(((float)dst_local._7_1_ / 255.0) * 15.0));
      *(ushort *)((long)dst->data + (long)(y * dst->width + x) * 2) =
           (ushort)(byte)(int)dVar1 << 0xc | (ushort)(byte)(int)dVar2 << 8 |
           (ushort)(byte)(int)dVar3 << 4 | (ushort)(byte)(int)dVar4;
      break;
    case 7:
      *(uchar *)((long)dst->data + (long)((y * dst->width + x) * 4)) = dst_local._4_1_;
      *(byte *)((long)dst->data + (long)((y * dst->width + x) * 4 + 1)) = dst_local._5_1_;
      *(byte *)((long)dst->data + (long)((y * dst->width + x) * 4 + 2)) = dst_local._6_1_;
      *(byte *)((long)dst->data + (long)((y * dst->width + x) * 4 + 3)) = dst_local._7_1_;
      break;
    case 8:
      *(float *)((long)dst->data + (long)(y * dst->width + x) * 4) =
           ((float)dst_local._6_1_ / 255.0) * 0.114 +
           ((float)((uint)color & 0xff) / 255.0) * 0.299 + ((float)dst_local._5_1_ / 255.0) * 0.587;
      break;
    case 9:
      *(float *)((long)dst->data + (long)((y * dst->width + x) * 3) * 4) =
           (float)((uint)color & 0xff) / 255.0;
      *(float *)((long)dst->data + (long)((y * dst->width + x) * 3 + 1) * 4) =
           (float)dst_local._5_1_ / 255.0;
      *(float *)((long)dst->data + (long)((y * dst->width + x) * 3 + 2) * 4) =
           (float)dst_local._6_1_ / 255.0;
      break;
    case 10:
      *(float *)((long)dst->data + (long)((y * dst->width + x) * 4) * 4) =
           (float)((uint)color & 0xff) / 255.0;
      *(float *)((long)dst->data + (long)((y * dst->width + x) * 4 + 1) * 4) =
           (float)dst_local._5_1_ / 255.0;
      *(float *)((long)dst->data + (long)((y * dst->width + x) * 4 + 2) * 4) =
           (float)dst_local._6_1_ / 255.0;
      *(float *)((long)dst->data + (long)((y * dst->width + x) * 4 + 3) * 4) =
           (float)dst_local._7_1_ / 255.0;
    }
  }
  return;
}

Assistant:

void ImageDrawPixel(Image *dst, int x, int y, Color color)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (x < 0) || (x >= dst->width) || (y < 0) || (y >= dst->height)) return;

    switch (dst->format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dst->data)[y*dst->width + x] = gray;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dst->data)[(y*dst->width + x)*2] = gray;
            ((unsigned char *)dst->data)[(y*dst->width + x)*2 + 1] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            // NOTE: Calculate R5G6B5 equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*63.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*31.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));
            unsigned char a = (coln.w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;;

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*15.0f));
            unsigned char g = (unsigned char)(round(coln.y*15.0f));
            unsigned char b = (unsigned char)(round(coln.z*15.0f));
            unsigned char a = (unsigned char)(round(coln.w*15.0f));

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
        {
            ((unsigned char *)dst->data)[(y*dst->width + x)*3] = color.r;
            ((unsigned char *)dst->data)[(y*dst->width + x)*3 + 1] = color.g;
            ((unsigned char *)dst->data)[(y*dst->width + x)*3 + 2] = color.b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
        {
            ((unsigned char *)dst->data)[(y*dst->width + x)*4] = color.r;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 1] = color.g;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 2] = color.b;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 3] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32:
        {
            // NOTE: Calculate grayscale equivalent color (normalized to 32bit)
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            ((float *)dst->data)[y*dst->width + x] = coln.x*0.299f + coln.y*0.587f + coln.z*0.114f;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
        {
            // NOTE: Calculate R32G32B32 equivalent color (normalized to 32bit)
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            ((float *)dst->data)[(y*dst->width + x)*3] = coln.x;
            ((float *)dst->data)[(y*dst->width + x)*3 + 1] = coln.y;
            ((float *)dst->data)[(y*dst->width + x)*3 + 2] = coln.z;
        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
        {
            // NOTE: Calculate R32G32B32A32 equivalent color (normalized to 32bit)
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            ((float *)dst->data)[(y*dst->width + x)*4] = coln.x;
            ((float *)dst->data)[(y*dst->width + x)*4 + 1] = coln.y;
            ((float *)dst->data)[(y*dst->width + x)*4 + 2] = coln.z;
            ((float *)dst->data)[(y*dst->width + x)*4 + 3] = coln.w;

        } break;
        default: break;
    }
}